

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_train.cc
# Opt level: O2

void run(vw *vw)

{
  ezexample *peVar1;
  allocator local_201;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  ezexample ex;
  
  ezexample::ezexample(&ex,vw,true,(vw *)0x0);
  ezexample::addns(&ex,'s');
  peVar1 = ezexample::operator()(&ex,"p^the_man");
  peVar1 = ezexample::operator()(peVar1,"w^the");
  peVar1 = ezexample::operator()(peVar1,"w^man");
  ezexample::addns(peVar1,'t');
  peVar1 = ezexample::operator()(peVar1,"p^un_homme");
  peVar1 = ezexample::operator()(peVar1,"w^un");
  ezexample::operator()(peVar1,"w^homme");
  std::__cxx11::string::string((string *)&local_1a0,"1:1",&local_201);
  ezexample::set_label(&ex,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  ezexample::train(&ex);
  ezexample::remns(&ex);
  ezexample::addns(&ex,'t');
  peVar1 = ezexample::operator()(&ex,"p^le_homme");
  peVar1 = ezexample::operator()(peVar1,"w^le");
  ezexample::operator()(peVar1,"w^homme");
  std::__cxx11::string::string((string *)&local_1c0,"2:0",&local_201);
  ezexample::set_label(&ex,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  ezexample::train(&ex);
  ezexample::finish(&ex);
  ezexample::addns(&ex,'s');
  peVar1 = ezexample::operator()(&ex,"p^a_man");
  peVar1 = ezexample::operator()(peVar1,"w^a");
  peVar1 = ezexample::operator()(peVar1,"w^man");
  ezexample::addns(peVar1,'t');
  peVar1 = ezexample::operator()(peVar1,"p^un_homme");
  peVar1 = ezexample::operator()(peVar1,"w^un");
  ezexample::operator()(peVar1,"w^homme");
  std::__cxx11::string::string((string *)&local_1e0,"1:0",&local_201);
  ezexample::set_label(&ex,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  ezexample::train(&ex);
  ezexample::remns(&ex);
  ezexample::addns(&ex,'t');
  peVar1 = ezexample::operator()(&ex,"p^le_homme");
  peVar1 = ezexample::operator()(peVar1,"w^le");
  ezexample::operator()(peVar1,"w^homme");
  std::__cxx11::string::string((string *)&local_200,"2:1",&local_201);
  ezexample::set_label(&ex,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  ezexample::train(&ex);
  ezexample::finish(&ex);
  ezexample::~ezexample(&ex);
  return;
}

Assistant:

void run(vw*vw)
{ ezexample ex(vw, true);   // we're doing csoaa_ldf so we need multiline examples

  /// BEGIN FIRST MULTILINE EXAMPLE
  ex(vw_namespace('s'))
  ("p^the_man")
  ("w^the")
  ("w^man")
  (vw_namespace('t'))
  ("p^un_homme")
  ("w^un")
  ("w^homme");

  ex.set_label("1:1");
  ex.train();

  --ex;   // remove the most recent namespace
  ex(vw_namespace('t'))
  ("p^le_homme")
  ("w^le")
  ("w^homme");

  ex.set_label("2:0");
  ex.train();

  // push it through VW for training
  ex.finish();

  /// BEGIN SECOND MULTILINE EXAMPLE
  ex(vw_namespace('s'))
  ("p^a_man")
  ("w^a")
  ("w^man")
  (vw_namespace('t'))
  ("p^un_homme")
  ("w^un")
  ("w^homme");

  ex.set_label("1:0");
  ex.train();

  --ex;   // remove the most recent namespace
  ex(vw_namespace('t'))
  ("p^le_homme")
  ("w^le")
  ("w^homme");

  ex.set_label("2:1");
  ex.train();

  // push it through VW for training
  ex.finish();
}